

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

DWORD GetCurrentThreadId(void)

{
  long lVar1;
  DWORD dwThreadId;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  lVar1 = syscall(0xba);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (DWORD)lVar1;
}

Assistant:

DWORD
PALAPI
GetCurrentThreadId(
            VOID)
{
    DWORD dwThreadId;

    PERF_ENTRY(GetCurrentThreadId);
    ENTRY("GetCurrentThreadId()\n");

    dwThreadId = (DWORD)THREADSilentGetCurrentThreadId();

    LOGEXIT("GetCurrentThreadId returns DWORD %#x\n", dwThreadId);
    PERF_EXIT(GetCurrentThreadId);

    return dwThreadId;
}